

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-backend.cpp
# Opt level: O3

void * ggml_backend_buffer_get_base(ggml_backend_buffer_t buffer)

{
  void *pvVar1;
  
  if (buffer->size == 0) {
    pvVar1 = (void *)0x0;
  }
  else {
    pvVar1 = (*(buffer->iface).get_base)(buffer);
    if (pvVar1 == (void *)0x0) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-backend.cpp"
                 ,0x7d,"GGML_ASSERT(%s) failed",
                 "base != NULL && \"backend buffer base cannot be NULL\"");
    }
  }
  return pvVar1;
}

Assistant:

void * ggml_backend_buffer_get_base(ggml_backend_buffer_t buffer) {
    // get_base is optional if the buffer is zero-sized
    if (buffer->size == 0) {
        return NULL;
    }

    void * base = buffer->iface.get_base(buffer);

    GGML_ASSERT(base != NULL && "backend buffer base cannot be NULL");

    return base;
}